

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dish.cpp
# Opt level: O1

void __thiscall Dish::Dish(Dish *this,int d_id,string *d_name,int d_price,DishType d_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->id = d_id;
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (d_name->_M_dataplus)._M_p;
  paVar2 = &d_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&d_name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar4;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar3;
    (this->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name)._M_string_length = d_name->_M_string_length;
  (d_name->_M_dataplus)._M_p = (pointer)paVar2;
  d_name->_M_string_length = 0;
  (d_name->field_2)._M_local_buf[0] = '\0';
  this->price = d_price;
  this->type = d_type;
  return;
}

Assistant:

Dish::Dish(int d_id, std::string d_name, int d_price, DishType d_type) : id(d_id), name(std::move(d_name)), price(d_price), type(d_type){}